

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

CURLcode set_trace_config(GlobalConfig *global,char *config)

{
  int iVar1;
  CURLcode CVar2;
  char *__s;
  char *pcVar3;
  _Bool _Var4;
  
  __s = strdup(config);
  if (__s == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar3 = strtok(__s,", ");
    while (pcVar3 != (char *)0x0) {
      _Var4 = true;
      if (*pcVar3 == '+') {
        pcVar3 = pcVar3 + 1;
      }
      else if (*pcVar3 == '-') {
        pcVar3 = pcVar3 + 1;
        _Var4 = false;
      }
      iVar1 = curl_strequal(pcVar3,"all");
      if (iVar1 == 0) {
        iVar1 = curl_strequal(pcVar3,"ids");
        if (iVar1 == 0) {
          iVar1 = curl_strequal(pcVar3,"time");
          if (iVar1 == 0) goto LAB_00111d1c;
          global->tracetime = _Var4;
        }
        else {
          global->traceids = _Var4;
        }
      }
      else {
        global->traceids = _Var4;
        global->tracetime = _Var4;
LAB_00111d1c:
        CVar2 = curl_global_trace();
        if (CVar2 != CURLE_OK) goto LAB_00111d7f;
      }
      pcVar3 = strtok((char *)0x0,", ");
    }
    CVar2 = CURLE_OK;
LAB_00111d7f:
    free(__s);
  }
  return CVar2;
}

Assistant:

static CURLcode set_trace_config(struct GlobalConfig *global,
                                 const char *config)
{
  CURLcode result = CURLE_OK;
  char *token, *tmp, *name;
  bool toggle;

  tmp = strdup(config);
  if(!tmp)
    return CURLE_OUT_OF_MEMORY;

  /* Allow strtok() here since this is not used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  token = strtok(tmp, ", ");
  while(token) {
    switch(*token) {
      case '-':
        toggle = FALSE;
        name = token + 1;
        break;
      case '+':
        toggle = TRUE;
        name = token + 1;
        break;
      default:
        toggle = TRUE;
        name = token;
        break;
    }

    if(strcasecompare(name, "all")) {
      global->traceids = toggle;
      global->tracetime = toggle;
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    else if(strcasecompare(name, "ids")) {
      global->traceids = toggle;
    }
    else if(strcasecompare(name, "time")) {
      global->tracetime = toggle;
    }
    else {
      result = curl_global_trace(token);
      if(result)
        goto out;
    }
    token = strtok(NULL, ", ");
  }
out:
  free(tmp);
  return result;
}